

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O3

uint32 __thiscall
Js::BufferBuilderOf<short,_true>::FixOffset(BufferBuilderOf<short,_true> *this,uint32 offset)

{
  (this->super_BufferBuilder).offset = offset;
  return offset + (uint)(0xfd < *(ushort *)&(this->super_BufferBuilder).field_0x14) * 2 + 1;
}

Assistant:

uint32 FixOffset(uint32 offset) override
        {
            this->offset = offset;

            if (useVariableIntEncoding)
            {
                if (UseOneByte())
                {
                    return this->offset + sizeof(serialization_alignment byte);
                }
                else if (UseTwoBytes())
                {
                    return this->offset + sizeof(serialization_alignment uint16) + SENTINEL_BYTE_COUNT;
                }

                return this->offset + sizeof(serialization_alignment T) + SENTINEL_BYTE_COUNT;
            }
            else
            {
                return this->offset + sizeof(serialization_alignment T);
            }
        }